

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackFrame.SystemV.cpp
# Opt level: O3

bool __thiscall
Js::Amd64StackFrame::InitializeByFrameId
          (Amd64StackFrame *this,void *frame,ScriptContext *scriptContext)

{
  void **ppvVar1;
  bool bVar2;
  size_t sVar3;
  
  this->frame = (void **)frame;
  bVar2 = ThreadContext::DoInterruptProbe(scriptContext->threadContext);
  sVar3 = 0x44;
  if (!bVar2) {
    sVar3 = ((ulong)scriptContext->threadContext->isThreadBound ^ 1) * 5 + 0x39;
  }
  this->stackCheckCodeHeight = sVar3;
  ppvVar1 = this->frame;
  this->addressOfCodeAddr = ppvVar1 + 1;
  this->codeAddr = ppvVar1[1];
  ppvVar1 = (void **)*ppvVar1;
  this->frame = ppvVar1;
  return ppvVar1 != (void **)0x0;
}

Assistant:

bool
Amd64StackFrame::InitializeByFrameId(void * frame, ScriptContext* scriptContext)
{
    this->frame = (void **)frame;

    this->stackCheckCodeHeight =
        scriptContext->GetThreadContext()->DoInterruptProbe() ? stackCheckCodeHeightWithInterruptProbe
        : scriptContext->GetThreadContext()->IsThreadBound() ? stackCheckCodeHeightThreadBound
        : stackCheckCodeHeightNotThreadBound;

    return Next();
}